

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oop_interface.cpp
# Opt level: O2

string * __thiscall
isotree::IsolationForest::to_sql
          (string *__return_storage_ptr__,IsolationForest *this,bool output_tree_num,bool index1,
          size_t tree_num,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *numeric_colnames,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *categ_colnames,
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *categ_levels)

{
  ExtIsoForest *model_outputs;
  ExtIsoForest *model_outputs_ext;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  out;
  
  model_outputs = (ExtIsoForest *)&this->model;
  if ((this->model).trees.
      super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->model).trees.
      super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    model_outputs = (ExtIsoForest *)0x0;
  }
  model_outputs_ext = &this->model_ext;
  if ((this->model_ext).hplanes.
      super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->model_ext).hplanes.
      super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    model_outputs_ext = (ExtIsoForest *)0x0;
  }
  generate_sql(&out,(IsoForest *)model_outputs,model_outputs_ext,numeric_colnames,categ_colnames,
               categ_levels,output_tree_num,index1,true,tree_num,this->nthreads);
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)
             out.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&out);
  return __return_storage_ptr__;
}

Assistant:

std::string IsolationForest::to_sql(bool output_tree_num, bool index1, size_t tree_num,
                                    const std::vector<std::string> &numeric_colnames,
                                    const std::vector<std::string> &categ_colnames,
                                    const std::vector<std::vector<std::string>> &categ_levels) const
{
    std::vector<std::string> out = generate_sql(
        (!this->model.trees.empty())? &this->model : nullptr,
        (!this->model_ext.hplanes.empty())? &this->model_ext : nullptr,
        numeric_colnames,
        categ_colnames,
        categ_levels,
        output_tree_num, index1, true, tree_num,
        this->nthreads
    );
    return out[0];
}